

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigpipe.h
# Opt level: O2

void sigpipe_ignore(Curl_easy *data,sigpipe_ignore *ig)

{
  sigaction action;
  
  ig->no_signal = (_Bool)((byte)(*(ulong *)&(data->set).field_0x910 >> 0x22) & 1);
  if (((data->set).field_0x914 & 4) == 0) {
    memset(ig,0,0x98);
    sigaction(0xd,(sigaction *)0x0,(sigaction *)ig);
    memcpy(&action,ig,0x98);
    action.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
    sigaction(0xd,(sigaction *)&action,(sigaction *)0x0);
  }
  return;
}

Assistant:

static void sigpipe_ignore(struct Curl_easy *data,
                           struct sigpipe_ignore *ig)
{
  /* get a local copy of no_signal because the Curl_easy might not be
     around when we restore */
  ig->no_signal = data->set.no_signal;
  if(!data->set.no_signal) {
    struct sigaction action;
    /* first, extract the existing situation */
    memset(&ig->old_pipe_act, 0, sizeof(struct sigaction));
    sigaction(SIGPIPE, NULL, &ig->old_pipe_act);
    action = ig->old_pipe_act;
    /* ignore this signal */
    action.sa_handler = SIG_IGN;
    sigaction(SIGPIPE, &action, NULL);
  }
}